

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O1

void __thiscall
dgConvexHull3d::TessellateTriangle
          (dgConvexHull3d *this,HaI32 level,dgVector *p0,dgVector *p1,dgVector *p2,HaI32 *count,
          dgBigVector *ouput,HaI32 *start)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  dgVector *pdVar38;
  undefined1 auVar39 [16];
  dgVector *pdVar41;
  dgTemplateVector<float> local_90;
  dgTemplateVector<float> local_80;
  dgTemplateVector<float> local_70;
  dgVector *local_60;
  dgVector *local_58;
  double local_50;
  undefined1 local_48 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  
  fVar23 = (p0->super_dgTemplateVector<float>).m_x;
  fVar1 = (p0->super_dgTemplateVector<float>).m_z;
  if (level != 0) {
    fVar2 = (p0->super_dgTemplateVector<float>).m_y;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar23),
                              ZEXT416((uint)fVar23));
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    fVar7 = auVar20._0_4_ + -1.0;
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar7),auVar12);
    uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar7),2);
    bVar11 = (bool)((byte)uVar10 & 1);
    if (0.0001 <= (float)((uint)bVar11 * (int)fVar7 + (uint)!bVar11 * auVar20._0_4_)) {
      __assert_fail("dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1c8,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    fVar7 = (p1->super_dgTemplateVector<float>).m_x;
    fVar3 = (p1->super_dgTemplateVector<float>).m_y;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar7),
                              ZEXT416((uint)fVar7));
    fVar4 = (p1->super_dgTemplateVector<float>).m_z;
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar8 = auVar20._0_4_ + -1.0;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar8),auVar13);
    uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar8),2);
    bVar11 = (bool)((byte)uVar10 & 1);
    if (0.0001 <= (float)((uint)bVar11 * (int)fVar8 + (uint)!bVar11 * auVar20._0_4_)) {
      __assert_fail("dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1c9,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    fVar8 = (p2->super_dgTemplateVector<float>).m_x;
    fVar5 = (p2->super_dgTemplateVector<float>).m_y;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),ZEXT416((uint)fVar8),
                              ZEXT416((uint)fVar8));
    fVar6 = (p2->super_dgTemplateVector<float>).m_z;
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
    fVar9 = auVar20._0_4_ + -1.0;
    auVar14._8_4_ = 0x80000000;
    auVar14._0_8_ = 0x8000000080000000;
    auVar14._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar14);
    uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar9),2);
    bVar11 = (bool)((byte)uVar10 & 1);
    if (0.0001 <= (float)((uint)bVar11 * (int)fVar9 + (uint)!bVar11 * auVar20._0_4_)) {
      __assert_fail("dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1ca,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    auVar20 = vinsertps_avx(ZEXT416((uint)(fVar7 + fVar23)),ZEXT416((uint)(fVar3 + fVar2)),0x10);
    auVar21 = vinsertps_avx(ZEXT416((uint)(fVar4 + fVar1)),
                            ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_w),0x10);
    local_70 = (dgTemplateVector<float>)vmovlhps_avx(auVar20,auVar21);
    if ((((uint)ABS(local_70.m_x) < 0x7f800000) && ((uint)ABS(local_70.m_y) < 0x7f800000)) &&
       (((uint)ABS(local_70.m_z) < 0x7f800000 && ((uint)ABS(local_70.m_w) < 0x7f800000)))) {
      auVar20 = vinsertps_avx(ZEXT416((uint)(fVar7 + fVar8)),ZEXT416((uint)(fVar3 + fVar5)),0x10);
      auVar21 = vinsertps_avx(ZEXT416((uint)(fVar4 + fVar6)),
                              ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_w),0x10);
      local_80 = (dgTemplateVector<float>)vmovlhps_avx(auVar20,auVar21);
      if (((((uint)ABS(local_80.m_x) < 0x7f800000) && ((uint)ABS(local_80.m_y) < 0x7f800000)) &&
          ((uint)ABS(local_80.m_z) < 0x7f800000)) && ((uint)ABS(local_80.m_w) < 0x7f800000)) {
        auVar20 = vinsertps_avx(ZEXT416((uint)(fVar23 + fVar8)),ZEXT416((uint)(fVar2 + fVar5)),0x10)
        ;
        auVar21 = vinsertps_avx(ZEXT416((uint)(fVar6 + fVar1)),
                                ZEXT416((uint)(p2->super_dgTemplateVector<float>).m_w),0x10);
        local_90 = (dgTemplateVector<float>)vmovlhps_avx(auVar20,auVar21);
        if (((((uint)ABS(local_90.m_x) < 0x7f800000) && ((uint)ABS(local_90.m_y) < 0x7f800000)) &&
            ((uint)ABS(local_90.m_z) < 0x7f800000)) && ((uint)ABS(local_90.m_w) < 0x7f800000)) {
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_70.m_x),ZEXT416((uint)local_70.m_x),
                                    ZEXT416((uint)(local_70.m_y * local_70.m_y)));
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_70.m_z),ZEXT416((uint)local_70.m_z),auVar20)
          ;
          local_58 = p1;
          if (auVar20._0_4_ < 0.0) {
            fVar23 = sqrtf(auVar20._0_4_);
          }
          else {
            auVar20 = vsqrtss_avx(auVar20,auVar20);
            fVar23 = auVar20._0_4_;
          }
          fVar23 = 1.0 / fVar23;
          if ((((uint)ABS(fVar23 * local_70.m_x) < 0x7f800000) &&
              ((uint)ABS(fVar23 * local_70.m_y) < 0x7f800000)) &&
             (((uint)ABS(fVar23 * local_70.m_z) < 0x7f800000 &&
              ((uint)ABS(local_70.m_w) < 0x7f800000)))) {
            auVar20 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_70.m_z)),
                                    ZEXT416((uint)local_70.m_w),0x10);
            auVar21 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_70.m_x)),
                                    ZEXT416((uint)(fVar23 * local_70.m_y)),0x10);
            local_70 = (dgTemplateVector<float>)vmovlhps_avx(auVar21,auVar20);
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_80.m_y * local_80.m_y)),
                                      ZEXT416((uint)local_80.m_x),ZEXT416((uint)local_80.m_x));
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_80.m_z),ZEXT416((uint)local_80.m_z),
                                      auVar20);
            if (auVar20._0_4_ < 0.0) {
              fVar23 = sqrtf(auVar20._0_4_);
            }
            else {
              auVar20 = vsqrtss_avx(auVar20,auVar20);
              fVar23 = auVar20._0_4_;
            }
            fVar23 = 1.0 / fVar23;
            if (((((uint)ABS(fVar23 * local_80.m_x) < 0x7f800000) &&
                 ((uint)ABS(fVar23 * local_80.m_y) < 0x7f800000)) &&
                ((uint)ABS(fVar23 * local_80.m_z) < 0x7f800000)) &&
               ((uint)ABS(local_80.m_w) < 0x7f800000)) {
              auVar20 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_80.m_z)),
                                      ZEXT416((uint)local_80.m_w),0x10);
              auVar21 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_80.m_x)),
                                      ZEXT416((uint)(fVar23 * local_80.m_y)),0x10);
              local_80 = (dgTemplateVector<float>)vmovlhps_avx(auVar21,auVar20);
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_90.m_y * local_90.m_y)),
                                        ZEXT416((uint)local_90.m_x),ZEXT416((uint)local_90.m_x));
              auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_90.m_z),ZEXT416((uint)local_90.m_z),
                                        auVar20);
              if (auVar20._0_4_ < 0.0) {
                fVar23 = sqrtf(auVar20._0_4_);
              }
              else {
                auVar20 = vsqrtss_avx(auVar20,auVar20);
                fVar23 = auVar20._0_4_;
              }
              fVar23 = 1.0 / fVar23;
              if ((((uint)ABS(fVar23 * local_90.m_x) < 0x7f800000) &&
                  ((uint)ABS(fVar23 * local_90.m_y) < 0x7f800000)) &&
                 (((uint)ABS(fVar23 * local_90.m_z) < 0x7f800000 &&
                  ((uint)ABS(local_90.m_w) < 0x7f800000)))) {
                auVar20 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_90.m_z)),
                                        ZEXT416((uint)local_90.m_w),0x10);
                auVar21 = vinsertps_avx(ZEXT416((uint)(fVar23 * local_90.m_x)),
                                        ZEXT416((uint)(fVar23 * local_90.m_y)),0x10);
                local_90 = (dgTemplateVector<float>)vmovlhps_avx(auVar21,auVar20);
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_70.m_y * local_70.m_y)),
                                          ZEXT416((uint)local_70.m_x),ZEXT416((uint)local_70.m_x));
                auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_70.m_z),ZEXT416((uint)local_70.m_z),
                                          auVar20);
                fVar23 = auVar20._0_4_ + -1.0;
                auVar15._8_4_ = 0x80000000;
                auVar15._0_8_ = 0x8000000080000000;
                auVar15._12_4_ = 0x80000000;
                auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar23),auVar15);
                uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar23),2);
                bVar11 = (bool)((byte)uVar10 & 1);
                if (0.0001 <= (float)((uint)bVar11 * (int)fVar23 + (uint)!bVar11 * auVar20._0_4_)) {
                  __assert_fail("dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                                ,0x1d3,
                                "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                               );
                }
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_80.m_y * local_80.m_y)),
                                          ZEXT416((uint)local_80.m_x),ZEXT416((uint)local_80.m_x));
                auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_80.m_z),ZEXT416((uint)local_80.m_z),
                                          auVar20);
                fVar23 = auVar20._0_4_ + -1.0;
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar23),auVar16);
                uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar23),2);
                bVar11 = (bool)((byte)uVar10 & 1);
                if ((float)((uint)bVar11 * (int)fVar23 + (uint)!bVar11 * auVar20._0_4_) < 0.0001) {
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_90.m_y * local_90.m_y)),
                                            ZEXT416((uint)local_90.m_x),ZEXT416((uint)local_90.m_x))
                  ;
                  auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_90.m_z),ZEXT416((uint)local_90.m_z),
                                            auVar20);
                  fVar23 = auVar20._0_4_ + -1.0;
                  auVar17._8_4_ = 0x80000000;
                  auVar17._0_8_ = 0x8000000080000000;
                  auVar17._12_4_ = 0x80000000;
                  auVar20 = vxorps_avx512vl(ZEXT416((uint)fVar23),auVar17);
                  uVar10 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar23),2);
                  bVar11 = (bool)((byte)uVar10 & 1);
                  local_60 = p2;
                  if ((float)((uint)bVar11 * (int)fVar23 + (uint)!bVar11 * auVar20._0_4_) < 0.0001)
                  {
                    iVar19 = level + -1;
                    TessellateTriangle(this,iVar19,p0,(dgVector *)&local_70,(dgVector *)&local_90,
                                       count,ouput,start);
                    TessellateTriangle(this,iVar19,local_58,(dgVector *)&local_80,
                                       (dgVector *)&local_70,count,ouput,start);
                    TessellateTriangle(this,iVar19,local_60,(dgVector *)&local_90,
                                       (dgVector *)&local_80,count,ouput,start);
                    TessellateTriangle(this,iVar19,(dgVector *)&local_70,(dgVector *)&local_80,
                                       (dgVector *)&local_90,count,ouput,start);
                    return;
                  }
                  __assert_fail("dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                                ,0x1d5,
                                "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                               );
                }
                __assert_fail("dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                              ,0x1d4,
                              "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                             );
              }
            }
          }
        }
      }
    }
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
  }
  auVar20._0_8_ = (double)fVar23;
  auVar20._8_8_ = 0;
  fVar2 = (p0->super_dgTemplateVector<float>).m_y;
  fVar7 = (p0->super_dgTemplateVector<float>).m_w;
  dVar24 = (double)fVar2;
  auVar21._0_8_ = (double)fVar1;
  auVar21._8_8_ = 0;
  if (((((long)ABS(auVar20._0_8_) < 0x7ff0000000000000) && (!NAN(fVar23))) &&
      ((long)ABS(dVar24) < 0x7ff0000000000000)) &&
     (((!NAN(fVar2) && ((long)ABS(auVar21._0_8_) < 0x7ff0000000000000)) &&
      ((!NAN(fVar1) && (((uint)ABS(fVar7) < 0x7f800000 && (!NAN(fVar7))))))))) {
    fVar23 = (p1->super_dgTemplateVector<float>).m_x;
    fVar1 = (p1->super_dgTemplateVector<float>).m_y;
    dVar26 = (double)fVar23;
    dVar28 = (double)fVar1;
    fVar2 = (p1->super_dgTemplateVector<float>).m_z;
    dVar31 = (double)fVar2;
    fVar7 = (p1->super_dgTemplateVector<float>).m_w;
    if (((long)ABS(dVar26) < 0x7ff0000000000000) &&
       (((((!NAN(fVar23) && ((long)ABS(dVar28) < 0x7ff0000000000000)) && (!NAN(fVar1))) &&
         (((long)ABS(dVar31) < 0x7ff0000000000000 && (!NAN(fVar2))))) &&
        (((uint)ABS(fVar7) < 0x7f800000 && (!NAN(fVar7))))))) {
      fVar23 = (p2->super_dgTemplateVector<float>).m_x;
      fVar1 = (p2->super_dgTemplateVector<float>).m_y;
      dVar33 = (double)fVar23;
      dVar35 = (double)fVar1;
      fVar2 = (p2->super_dgTemplateVector<float>).m_z;
      dVar37 = (double)fVar2;
      fVar7 = (p2->super_dgTemplateVector<float>).m_w;
      if (((((long)ABS(dVar33) < 0x7ff0000000000000) && (!NAN(fVar23))) &&
          ((long)ABS(dVar35) < 0x7ff0000000000000)) &&
         ((((!NAN(fVar1) && ((long)ABS(dVar37) < 0x7ff0000000000000)) && (!NAN(fVar2))) &&
          (((uint)ABS(fVar7) < 0x7f800000 && (!NAN(fVar7))))))) {
        dVar26 = dVar26 - auVar20._0_8_;
        dVar28 = dVar28 - dVar24;
        dVar31 = dVar31 - auVar21._0_8_;
        dVar33 = dVar33 - auVar20._0_8_;
        dVar35 = dVar35 - dVar24;
        dVar37 = dVar37 - auVar21._0_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar28;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar37;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar35 * dVar31;
        auVar29 = vfmsub231sd_fma(auVar42,auVar29,auVar39);
        pdVar41 = auVar29._0_8_;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar31;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar33;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar37 * dVar26;
        auVar27 = vfmsub231sd_fma(auVar40,auVar34,auVar32);
        pdVar38 = auVar27._0_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar26;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar33 * dVar28;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar35;
        auVar27 = vfmsub231sd_fma(auVar30,auVar27,auVar36);
        dVar26 = auVar27._0_8_;
        if ((0x7fefffffffffffff < ((ulong)pdVar41 & 0x7fffffffffffffff)) ||
           ((0x7fefffffffffffff < (ulong)ABS((double)pdVar38) ||
            (0x7fefffffffffffff < (ulong)ABS(dVar26))))) {
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (double)pdVar38 * dVar24;
        auVar20 = vfmadd213sd_fma(auVar20,auVar29,auVar25);
        auVar20 = vfmadd213sd_fma(auVar21,auVar27,auVar20);
        auVar18._12_4_ = 0x80000000;
        auVar18._0_12_ = ZEXT812(0x8000000000000000);
        auVar21 = vxorpd_avx512vl(auVar20,auVar18);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (double)pdVar38 * (double)pdVar38;
        auVar20 = vfmadd231sd_fma(auVar22,auVar29,auVar29);
        auVar20 = vfmadd231sd_fma(auVar20,auVar27,auVar27);
        if (auVar20._0_8_ < 0.0) {
          local_60 = pdVar38;
          local_58 = pdVar41;
          local_50 = dVar26;
          local_48 = auVar21;
          dVar28 = sqrt(auVar20._0_8_);
          pdVar41 = local_58;
          pdVar38 = local_60;
          dVar26 = local_50;
          dVar24 = (double)local_48._0_8_;
        }
        else {
          auVar20 = vsqrtsd_avx(auVar20,auVar20);
          dVar28 = auVar20._0_8_;
          dVar24 = auVar21._0_8_;
        }
        dVar28 = 1.0 / dVar28;
        dVar31 = (double)pdVar38 * dVar28;
        dVar26 = dVar26 * dVar28;
        if ((((!NAN(dVar28 * dVar24)) && ((long)ABS(dVar28 * dVar24) < 0x7ff0000000000000)) &&
            (!NAN(dVar26))) &&
           ((((long)ABS(dVar26) < 0x7ff0000000000000 && (!NAN(dVar31))) &&
            (((long)ABS((double)pdVar41 * dVar28) < 0x7ff0000000000000 &&
             ((long)ABS(dVar31) < 0x7ff0000000000000)))))) {
          iVar19 = *start;
          ouput[iVar19].super_dgTemplateVector<double>.m_x = (double)pdVar41 * dVar28;
          ouput[iVar19].super_dgTemplateVector<double>.m_y = dVar31;
          ouput[iVar19].super_dgTemplateVector<double>.m_z = dVar26;
          ouput[iVar19].super_dgTemplateVector<double>.m_w = 0.0;
          *start = *start + 8;
          *count = *count + 1;
          return;
        }
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x159,
                      "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                     );
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x13f,"dgBigVector::dgBigVector(const dgVector &)");
}

Assistant:

void dgConvexHull3d::TessellateTriangle (hacd::HaI32 level, const dgVector& p0, const dgVector& p1, const dgVector& p2, hacd::HaI32& count, dgBigVector* const ouput, hacd::HaI32& start) const
{
	if (level) {
		HACD_ASSERT (dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		dgVector p01 (p0 + p1);
		dgVector p12 (p1 + p2);
		dgVector p20 (p2 + p0);

		p01 = p01.Scale (hacd::HaF32 (1.0f) / dgSqrt(p01 % p01));
		p12 = p12.Scale (hacd::HaF32 (1.0f) / dgSqrt(p12 % p12));
		p20 = p20.Scale (hacd::HaF32 (1.0f) / dgSqrt(p20 % p20));

		HACD_ASSERT (dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));

		TessellateTriangle  (level - 1, p0,  p01, p20, count, ouput, start);
		TessellateTriangle  (level - 1, p1,  p12, p01, count, ouput, start);
		TessellateTriangle  (level - 1, p2,  p20, p12, count, ouput, start);
		TessellateTriangle  (level - 1, p01, p12, p20, count, ouput, start);

	} else {
		dgBigPlane n (p0, p1, p2);
		n = n.Scale (hacd::HaF64(1.0f) / sqrt (n % n));
		n.m_w = hacd::HaF64(0.0f);
		ouput[start] = n;
		start += 8;
		count ++;
	}
}